

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::WriteDeviceLinkRule
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *output)

{
  cmOutputConverter *this_00;
  cmGeneratorTarget *pcVar1;
  cmMakefile *pcVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  pointer pbVar4;
  cmGeneratedFileStream *pcVar5;
  bool bVar6;
  TargetType targetType;
  int iVar7;
  string *psVar8;
  string *psVar9;
  undefined4 extraout_var;
  pointer pbVar10;
  string *obj;
  string_view separator;
  string_view arg;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  string_view value;
  allocator<char> local_3d1;
  cmLocalUnixMakefileGenerator3 *local_3d0;
  string linkFlags;
  string fatbinaryOutput;
  string local_368;
  string flags;
  string objectDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkDeps;
  string compileCmd;
  string fatbinaryCommand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fatbinaryDepends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cleanFiles;
  string local_270;
  string fatbinaryOutputRel;
  string relObjectDir;
  string architecturesStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  RuleVariables vars;
  string profiles;
  string registerFile;
  cmRulePlaceholderExpander *this_01;
  
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vars,"CUDA_ARCHITECTURES",(allocator<char> *)&linkFlags);
  psVar8 = cmGeneratorTarget::GetSafeProperty(pcVar1,(string *)&vars);
  std::__cxx11::string::string((string *)&architecturesStr,(string *)psVar8);
  std::__cxx11::string::~string((string *)&vars);
  value._M_str = architecturesStr._M_dataplus._M_p;
  value._M_len = architecturesStr._M_string_length;
  bVar6 = cmValue::IsOff(value);
  if (bVar6) {
    pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vars,
               "CUDA_SEPARABLE_COMPILATION on Clang requires CUDA_ARCHITECTURES to be set.",
               (allocator<char> *)&linkFlags);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)&vars);
    std::__cxx11::string::~string((string *)&vars);
  }
  else {
    pcVar3 = this->LocalGenerator;
    arg._M_str = architecturesStr._M_dataplus._M_p;
    arg._M_len = architecturesStr._M_string_length;
    cmExpandedList_abi_cxx11_(&architectures,arg,false);
    psVar8 = cmLocalUnixMakefileGenerator3::GetHomeRelativeOutputPath_abi_cxx11_(pcVar3);
    linkDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    linkDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    linkDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    AppendTargetDepends(this,&linkDeps,true);
    pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    GetConfigName_abi_cxx11_((string *)&vars,this);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&linkFlags,"CUDA",(allocator<char> *)&objectDir);
    local_3d0 = pcVar3;
    cmGeneratorTarget::GetLinkDepends(pcVar1,&linkDeps,(string *)&vars,&linkFlags);
    std::__cxx11::string::~string((string *)&linkFlags);
    std::__cxx11::string::~string((string *)&vars);
    pbVar4 = (this->Objects).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar10 = (this->Objects).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar4;
        pbVar10 = pbVar10 + 1) {
      vars.CMTargetType = (psVar8->_M_dataplus)._M_p;
      vars.CMTargetName = (char *)psVar8->_M_string_length;
      linkFlags._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
      linkFlags._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
      cmStrCat<>(&objectDir,(cmAlphaNum *)&vars,(cmAlphaNum *)&linkFlags);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&linkDeps,
                 &objectDir);
      std::__cxx11::string::~string((string *)&objectDir);
    }
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _Hashtable<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&vars,linkDeps.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
               linkDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,0,&linkFlags,&objectDir,&relObjectDir);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&linkDeps);
    std::__copy_move<false,false,std::forward_iterator_tag>::
    __copy_m<std::__detail::_Node_iterator<std::__cxx11::string,true,true>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                )vars.TargetPDB,
               (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                )0x0,&linkDeps);
    pcVar3 = local_3d0;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&vars);
    std::__cxx11::string::string
              ((string *)&objectDir,
               (string *)&((this->super_cmCommonTargetGenerator).GeneratorTarget)->ObjectDirectory);
    this_00 = &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter
    ;
    cmOutputConverter::MaybeRelativeToCurBinDir(&relObjectDir,this_00,&objectDir);
    cleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cleanFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmOutputConverter::MaybeRelativeToCurBinDir((string *)&vars,this_00,output);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cleanFiles,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars);
    std::__cxx11::string::~string((string *)&vars);
    profiles._M_dataplus._M_p = (pointer)&profiles.field_2;
    profiles._M_string_length = 0;
    profiles.field_2._M_local_buf[0] = '\0';
    fatbinaryDepends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fatbinaryDepends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fatbinaryDepends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vars.CMTargetName = (char *)objectDir._M_string_length;
    vars.CMTargetType = objectDir._M_dataplus._M_p;
    linkFlags._M_dataplus._M_p = (pointer)0x15;
    linkFlags._M_string_length = (long)"/cmake_cuda_register.h" + 1;
    cmStrCat<>(&registerFile,(cmAlphaNum *)&vars,(cmAlphaNum *)&linkFlags);
    for (pbVar10 = architectures.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar10 !=
        architectures.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar10 = pbVar10 + 1) {
      fatbinaryCommand._M_dataplus._M_p = (pointer)&fatbinaryCommand.field_2;
      fatbinaryCommand._M_string_length = 0;
      fatbinaryCommand.field_2._M_local_buf[0] = '\0';
      if (fatbinaryDepends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          fatbinaryDepends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        vars.CMTargetType = (psVar8->_M_dataplus)._M_p;
        vars.CMTargetName = (char *)psVar8->_M_string_length;
        linkFlags._M_dataplus._M_p = (pointer)relObjectDir._M_string_length;
        linkFlags._M_string_length = (size_type)relObjectDir._M_dataplus._M_p;
        cmStrCat<char[22]>(&fatbinaryOutput,(cmAlphaNum *)&vars,(cmAlphaNum *)&linkFlags,
                           (char (*) [22])0x5e1b3f);
        vars.CMTargetName = &DAT_0000001a;
        vars.CMTargetType = " --register-link-binaries=";
        linkFlags._M_dataplus._M_p = (pointer)fatbinaryOutput._M_string_length;
        linkFlags._M_string_length = (size_type)fatbinaryOutput._M_dataplus._M_p;
        cmStrCat<>(&fatbinaryOutputRel,(cmAlphaNum *)&vars,(cmAlphaNum *)&linkFlags);
        std::__cxx11::string::operator=((string *)&fatbinaryCommand,(string *)&fatbinaryOutputRel);
        std::__cxx11::string::~string((string *)&fatbinaryOutputRel);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&cleanFiles,&fatbinaryOutput);
        std::__cxx11::string::~string((string *)&fatbinaryOutput);
      }
      std::__cxx11::string::find((char)pbVar10,0x2d);
      std::__cxx11::string::substr((ulong)&fatbinaryOutput,(ulong)pbVar10);
      vars.CMTargetName = (char *)objectDir._M_string_length;
      vars.CMTargetType = objectDir._M_dataplus._M_p;
      linkFlags._M_dataplus._M_p = (pointer)0x3;
      linkFlags._M_string_length = (long)"/sm_" + 1;
      cmStrCat<std::__cxx11::string,char[7]>
                (&fatbinaryOutputRel,(cmAlphaNum *)&vars,(cmAlphaNum *)&linkFlags,&fatbinaryOutput,
                 (char (*) [7])".cubin");
      vars.CMTargetName = &DAT_00000010;
      vars.CMTargetType = " -im=profile=sm_";
      linkFlags._M_dataplus._M_p = (pointer)fatbinaryOutput._M_string_length;
      linkFlags._M_string_length = (size_type)fatbinaryOutput._M_dataplus._M_p;
      cmStrCat<char[7],std::__cxx11::string>
                (&flags,(cmAlphaNum *)&vars,(cmAlphaNum *)&linkFlags,(char (*) [7])",file=",
                 &fatbinaryOutputRel);
      std::__cxx11::string::append((string *)&profiles);
      std::__cxx11::string::~string((string *)&flags);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &fatbinaryDepends,&fatbinaryOutputRel);
      pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&compileCmd,"CMAKE_CUDA_DEVICE_LINKER",(allocator<char> *)&local_270);
      psVar9 = cmMakefile::GetRequiredDefinition(pcVar2,&compileCmd);
      vars.CMTargetType = (psVar9->_M_dataplus)._M_p;
      vars.CMTargetName = (char *)psVar9->_M_string_length;
      linkFlags._M_dataplus._M_p = (pointer)0xa;
      linkFlags._M_string_length = (size_type)anon_var_dwarf_14c0292;
      separator._M_str = " ";
      separator._M_len = 1;
      cmJoin(&local_368,&linkDeps,separator,(string_view)ZEXT816(0));
      cmStrCat<std::__cxx11::string,std::__cxx11::string,char[8],std::__cxx11::string>
                (&flags,(cmAlphaNum *)&vars,(cmAlphaNum *)&linkFlags,&fatbinaryOutput,
                 &fatbinaryCommand,(char (*) [8])" -o=$@ ",&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::~string((string *)&compileCmd);
      pcVar5 = (this->BuildFileStream)._M_t.
               super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
               .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
      std::__cxx11::string::string((string *)&vars,(string *)&flags);
      __l._M_len = 1;
      __l._M_array = (iterator)&vars;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&linkFlags,__l,(allocator_type *)&compileCmd);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (local_3d0,(ostream *)pcVar5,(char *)0x0,&fatbinaryOutputRel,&linkDeps,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&linkFlags,false,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&linkFlags);
      std::__cxx11::string::~string((string *)&vars);
      std::__cxx11::string::~string((string *)&flags);
      std::__cxx11::string::~string((string *)&fatbinaryOutputRel);
      std::__cxx11::string::~string((string *)&fatbinaryOutput);
      std::__cxx11::string::~string((string *)&fatbinaryCommand);
    }
    pcVar2 = (this->super_cmCommonTargetGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fatbinaryOutput,"CMAKE_CUDA_FATBINARY",
               (allocator<char> *)&fatbinaryOutputRel);
    psVar9 = cmMakefile::GetRequiredDefinition(pcVar2,&fatbinaryOutput);
    vars.CMTargetType = (psVar9->_M_dataplus)._M_p;
    vars.CMTargetName = (char *)psVar9->_M_string_length;
    linkFlags._M_dataplus._M_p = &DAT_00000045;
    linkFlags._M_string_length = (size_type)anon_var_dwarf_14c02b9;
    cmStrCat<std::__cxx11::string>
              (&fatbinaryCommand,(cmAlphaNum *)&vars,(cmAlphaNum *)&linkFlags,&profiles);
    std::__cxx11::string::~string((string *)&fatbinaryOutput);
    vars.CMTargetName = (char *)objectDir._M_string_length;
    vars.CMTargetType = objectDir._M_dataplus._M_p;
    linkFlags._M_dataplus._M_p = &DAT_00000013;
    linkFlags._M_string_length = (long)"/cmake_cuda_fatbin.h" + 1;
    cmStrCat<>(&fatbinaryOutput,(cmAlphaNum *)&vars,(cmAlphaNum *)&linkFlags);
    vars.CMTargetType = (psVar8->_M_dataplus)._M_p;
    vars.CMTargetName = (char *)psVar8->_M_string_length;
    linkFlags._M_dataplus._M_p = (pointer)relObjectDir._M_string_length;
    linkFlags._M_string_length = (size_type)relObjectDir._M_dataplus._M_p;
    cmStrCat<char[20]>(&fatbinaryOutputRel,(cmAlphaNum *)&vars,(cmAlphaNum *)&linkFlags,
                       (char (*) [20])0x5e1b6e);
    pcVar5 = (this->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&vars,(string *)&fatbinaryCommand);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&vars;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&linkFlags,__l_00,(allocator_type *)&flags);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (local_3d0,(ostream *)pcVar5,(char *)0x0,&fatbinaryOutputRel,&fatbinaryDepends,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&linkFlags,false,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&linkFlags);
    std::__cxx11::string::~string((string *)&vars);
    memset(&vars,0,0x150);
    psVar8 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    vars.CMTargetName = (psVar8->_M_dataplus)._M_p;
    targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
    psVar8 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
    vars.CMTargetType = (psVar8->_M_dataplus)._M_p;
    vars.Language = "CUDA";
    vars.Object = (output->_M_dataplus)._M_p;
    vars.Fatbinary = fatbinaryOutput._M_dataplus._M_p;
    vars.RegisterFile = registerFile._M_dataplus._M_p;
    linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
    linkFlags._M_string_length = 0;
    linkFlags.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&flags,"CUDA",(allocator<char> *)&compileCmd);
    GetDeviceLinkFlags(this,&linkFlags,&flags);
    std::__cxx11::string::~string((string *)&flags);
    vars.LinkFlags = linkFlags._M_dataplus._M_p;
    std::__cxx11::string::string<std::allocator<char>>((string *)&compileCmd,"CUDA",&local_3d1);
    GetConfigName_abi_cxx11_(&local_368,this);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    local_270._M_string_length = 0;
    local_270.field_2._M_local_buf[0] = '\0';
    cmCommonTargetGenerator::GetFlags
              (&flags,&this->super_cmCommonTargetGenerator,&compileCmd,&local_368,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&compileCmd);
    vars.Flags = flags._M_dataplus._M_p;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"CMAKE_CUDA_DEVICE_LINK_COMPILE",(allocator<char> *)&local_270);
    GetLinkRule(&compileCmd,this,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    iVar7 = (*(local_3d0->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              _vptr_cmLocalGenerator[5])();
    this_01 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar7);
    cmRulePlaceholderExpander::ExpandRuleVariables(this_01,this_00,&compileCmd,&vars);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,
               &compileCmd);
    pcVar5 = (this->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&local_368,(string *)&fatbinaryOutputRel);
    __l_01._M_len = 1;
    __l_01._M_array = &local_368;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_270,__l_01,(allocator_type *)&local_3d1);
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (local_3d0,(ostream *)pcVar5,(char *)0x0,output,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_270,commands,false,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_270);
    std::__cxx11::string::~string((string *)&local_368);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::
    _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->CleanFiles,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )cleanFiles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )cleanFiles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    (*(this_01->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])(this_01);
    std::__cxx11::string::~string((string *)&compileCmd);
    std::__cxx11::string::~string((string *)&flags);
    std::__cxx11::string::~string((string *)&linkFlags);
    std::__cxx11::string::~string((string *)&fatbinaryOutputRel);
    std::__cxx11::string::~string((string *)&fatbinaryOutput);
    std::__cxx11::string::~string((string *)&fatbinaryCommand);
    std::__cxx11::string::~string((string *)&registerFile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&fatbinaryDepends);
    std::__cxx11::string::~string((string *)&profiles);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cleanFiles);
    std::__cxx11::string::~string((string *)&relObjectDir);
    std::__cxx11::string::~string((string *)&objectDir);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&linkDeps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&architectures);
  }
  std::__cxx11::string::~string((string *)&architecturesStr);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteDeviceLinkRule(
  std::vector<std::string>& commands, const std::string& output)
{
  std::string architecturesStr =
    this->GeneratorTarget->GetSafeProperty("CUDA_ARCHITECTURES");

  if (cmIsOff(architecturesStr)) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 "CUDA_SEPARABLE_COMPILATION on Clang "
                                 "requires CUDA_ARCHITECTURES to be set.");
    return;
  }

  cmLocalUnixMakefileGenerator3* localGen{ this->LocalGenerator };
  std::vector<std::string> architectures = cmExpandedList(architecturesStr);
  std::string const& relPath = localGen->GetHomeRelativeOutputPath();

  // Ensure there are no duplicates.
  const std::vector<std::string> linkDeps = [&]() -> std::vector<std::string> {
    std::vector<std::string> deps;
    this->AppendTargetDepends(deps, true);
    this->GeneratorTarget->GetLinkDepends(deps, this->GetConfigName(), "CUDA");

    for (std::string const& obj : this->Objects) {
      deps.emplace_back(cmStrCat(relPath, obj));
    }

    std::unordered_set<std::string> depsSet(deps.begin(), deps.end());
    deps.clear();
    std::copy(depsSet.begin(), depsSet.end(), std::back_inserter(deps));
    return deps;
  }();

  const std::string objectDir = this->GeneratorTarget->ObjectDirectory;
  const std::string relObjectDir =
    localGen->MaybeRelativeToCurBinDir(objectDir);

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> cleanFiles;
  cleanFiles.push_back(localGen->MaybeRelativeToCurBinDir(output));

  std::string profiles;
  std::vector<std::string> fatbinaryDepends;
  std::string const registerFile =
    cmStrCat(objectDir, "cmake_cuda_register.h");

  // Link device code for each architecture.
  for (const std::string& architectureKind : architectures) {
    std::string registerFileCmd;

    // The generated register file contains macros that when expanded
    // register the device routines. Because the routines are the same for
    // all architectures the register file will be the same too. Thus
    // generate it only on the first invocation to reduce overhead.
    if (fatbinaryDepends.empty()) {
      std::string const registerFileRel =
        cmStrCat(relPath, relObjectDir, "cmake_cuda_register.h");
      registerFileCmd =
        cmStrCat(" --register-link-binaries=", registerFileRel);
      cleanFiles.push_back(registerFileRel);
    }

    // Clang always generates real code, so strip the specifier.
    const std::string architecture =
      architectureKind.substr(0, architectureKind.find('-'));
    const std::string cubin =
      cmStrCat(objectDir, "sm_", architecture, ".cubin");

    profiles += cmStrCat(" -im=profile=sm_", architecture, ",file=", cubin);
    fatbinaryDepends.emplace_back(cubin);

    std::string command = cmStrCat(
      this->Makefile->GetRequiredDefinition("CMAKE_CUDA_DEVICE_LINKER"),
      " -arch=sm_", architecture, registerFileCmd, " -o=$@ ",
      cmJoin(linkDeps, " "));

    localGen->WriteMakeRule(*this->BuildFileStream, nullptr, cubin, linkDeps,
                            { command }, false);
  }

  // Combine all architectures into a single fatbinary.
  const std::string fatbinaryCommand =
    cmStrCat(this->Makefile->GetRequiredDefinition("CMAKE_CUDA_FATBINARY"),
             " -64 -cmdline=--compile-only -compress-all -link "
             "--embedded-fatbin=$@",
             profiles);
  const std::string fatbinaryOutput =
    cmStrCat(objectDir, "cmake_cuda_fatbin.h");
  const std::string fatbinaryOutputRel =
    cmStrCat(relPath, relObjectDir, "cmake_cuda_fatbin.h");

  localGen->WriteMakeRule(*this->BuildFileStream, nullptr, fatbinaryOutputRel,
                          fatbinaryDepends, { fatbinaryCommand }, false);

  // Compile the stub that registers the kernels and contains the
  // fatbinaries.
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()).c_str();

  vars.Language = "CUDA";
  vars.Object = output.c_str();
  vars.Fatbinary = fatbinaryOutput.c_str();
  vars.RegisterFile = registerFile.c_str();

  std::string linkFlags;
  this->GetDeviceLinkFlags(linkFlags, "CUDA");
  vars.LinkFlags = linkFlags.c_str();

  std::string flags = this->GetFlags("CUDA", this->GetConfigName());
  vars.Flags = flags.c_str();

  std::string compileCmd = this->GetLinkRule("CMAKE_CUDA_DEVICE_LINK_COMPILE");
  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    localGen->CreateRulePlaceholderExpander());
  rulePlaceholderExpander->ExpandRuleVariables(localGen, compileCmd, vars);

  commands.emplace_back(compileCmd);
  localGen->WriteMakeRule(*this->BuildFileStream, nullptr, output,
                          { fatbinaryOutputRel }, commands, false);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(cleanFiles.begin(), cleanFiles.end());
}